

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *
wasm::WATParser::anon_unknown_11::
results<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  undefined8 *puVar1;
  _Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *this;
  undefined1 uVar2;
  bool bVar3;
  bool bVar4;
  string_view expected;
  undefined1 local_c8 [8];
  Result<wasm::Type> type;
  Result<wasm::Type> _val;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  void *pvStack_58;
  ResultsT res;
  
  pvStack_58 = (void *)0x0;
  res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bVar4 = false;
  this = (_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)
         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20);
  while (expected._M_str = "result", expected._M_len = 6,
        bVar3 = ParseInput::takeSExprStart(&ctx->in,expected), bVar3) {
    while (bVar4 = ParseInput::takeRParen(&ctx->in), !bVar4) {
      valtype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                ((Result<wasm::Type> *)local_c8,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)this,
                      (_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)local_c8);
      uVar2 = _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
        _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20),
                   type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_,
                   (long)_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u.
                         _M_first._M_storage.id +
                   type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar1;
        if ((undefined1 *)
            _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ == &local_68) {
          *puVar1 = CONCAT71(uStack_67,local_68);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = uStack_60;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).
            super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
               = _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                    + 0x10) = CONCAT71(uStack_67,local_68);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 8) = local_70;
        local_68 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ = &local_68;
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)
                          ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_c8);
        goto LAB_00a2305c;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage(this);
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ = local_c8;
      if (res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)&pvStack_58,
                   (iterator)
                   res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start,(Type *)this);
      }
      else {
        (res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)local_c8;
        res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_c8);
      if (uVar2 == '\x01') goto LAB_00a2305c;
    }
    bVar4 = true;
  }
  if (bVar4) {
    *(void **)&(__return_storage_ptr__->val).
               super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         = pvStack_58;
    *(pointer *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 8) = res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x10) = res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
    pvStack_58 = (void *)0x0;
    res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\0';
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x01';
  }
LAB_00a2305c:
  if (pvStack_58 != (void *)0x0) {
    operator_delete(pvStack_58,
                    (long)res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pvStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}